

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asynclog.cpp
# Opt level: O0

void __thiscall AsyncLog::AsyncLog(AsyncLog *this)

{
  Mutex *this_00;
  Condition *pCVar1;
  type pMVar2;
  FixedBuffer<4096UL> *pFVar3;
  LogFile *this_01;
  AsyncLog *local_70;
  code *local_68;
  undefined8 local_60;
  type local_58;
  CallFunc local_40;
  AsyncLog *local_10;
  AsyncLog *this_local;
  
  this->m_bRunning = false;
  local_10 = this;
  this_00 = (Mutex *)operator_new(0x28);
  Mutex::Mutex(this_00);
  std::unique_ptr<Mutex,std::default_delete<Mutex>>::unique_ptr<std::default_delete<Mutex>,void>
            ((unique_ptr<Mutex,std::default_delete<Mutex>> *)&this->m_mutex,this_00);
  pCVar1 = (Condition *)operator_new(0x38);
  pMVar2 = std::unique_ptr<Mutex,_std::default_delete<Mutex>_>::operator*(&this->m_mutex);
  Condition::Condition(pCVar1,pMVar2);
  std::unique_ptr<Condition,std::default_delete<Condition>>::
  unique_ptr<std::default_delete<Condition>,void>
            ((unique_ptr<Condition,std::default_delete<Condition>> *)&this->m_mainThreadRunCond,
             pCVar1);
  pCVar1 = (Condition *)operator_new(0x38);
  pMVar2 = std::unique_ptr<Mutex,_std::default_delete<Mutex>_>::operator*(&this->m_mutex);
  Condition::Condition(pCVar1,pMVar2);
  std::unique_ptr<Condition,std::default_delete<Condition>>::
  unique_ptr<std::default_delete<Condition>,void>
            ((unique_ptr<Condition,std::default_delete<Condition>> *)&this->m_subThreadFlushCond,
             pCVar1);
  local_68 = ThreadFunc;
  local_60 = 0;
  local_70 = this;
  std::bind<void(AsyncLog::*)(),AsyncLog*>
            (&local_58,(offset_in_AsyncLog_to_subr *)&local_68,&local_70);
  std::function<void()>::function<std::_Bind<void(AsyncLog::*(AsyncLog*))()>,void>
            ((function<void()> *)&local_40,&local_58);
  Thread::Thread(&this->m_thread,&local_40);
  std::function<void_()>::~function(&local_40);
  pFVar3 = (FixedBuffer<4096UL> *)operator_new(0x1008);
  FixedBuffer<4096UL>::FixedBuffer(pFVar3);
  std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>::
  unique_ptr<std::default_delete<FixedBuffer<4096ul>>,void>
            ((unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>> *)
             &this->m_curBuff,pFVar3);
  pFVar3 = (FixedBuffer<4096UL> *)operator_new(0x1008);
  FixedBuffer<4096UL>::FixedBuffer(pFVar3);
  std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>::
  unique_ptr<std::default_delete<FixedBuffer<4096ul>>,void>
            ((unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>> *)
             &this->m_nextBuff,pFVar3);
  std::
  vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ::vector(&this->m_buffers);
  this_01 = (LogFile *)operator_new(0x28);
  LogFile::LogFile(this_01);
  std::unique_ptr<LogFile,std::default_delete<LogFile>>::
  unique_ptr<std::default_delete<LogFile>,void>
            ((unique_ptr<LogFile,std::default_delete<LogFile>> *)&this->m_logFilePtr,this_01);
  std::
  vector<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>,_std::allocator<std::unique_ptr<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>_>_>
  ::reserve(&this->m_buffers,8);
  return;
}

Assistant:

AsyncLog::AsyncLog()
	: m_bRunning(false),
	m_mutex (new Mutex), 
	m_mainThreadRunCond(new Condition(*m_mutex)),
	m_subThreadFlushCond(new Condition(*m_mutex)), 
	m_thread(std::bind(&AsyncLog::ThreadFunc, this)), 
	m_curBuff(new Buffer), 
	m_nextBuff(new Buffer),
	m_logFilePtr(new LogFile)
{
	m_buffers.reserve(8);
}